

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O3

void __thiscall draco::Decoder::SetSkipAttributeTransform(Decoder *this,Type att_type)

{
  Options *this_00;
  Type local_3c;
  string local_38;
  
  local_3c = att_type;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"skip_attribute_transform","")
  ;
  this_00 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeOptions
                      (&this->options_,&local_3c);
  Options::SetBool(this_00,&local_38,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Decoder::SetSkipAttributeTransform(GeometryAttribute::Type att_type) {
  options_.SetAttributeBool(att_type, "skip_attribute_transform", true);
}